

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O2

void __thiscall CHud::RenderTeambalanceWarning(CHud *this)

{
  CGameClient *pCVar1;
  ITextRender *pIVar2;
  uint uVar3;
  int iVar4;
  int64 iVar5;
  int64 iVar6;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  
  pCVar1 = (this->super_CComponent).m_pClient;
  if (((((pCVar1->m_GameInfo).m_GameFlags & 1) != 0) &&
      (pCVar1->m_pConfig->m_ClWarningTeambalance != 0)) &&
     ((pCVar1->m_ServerSettings).m_TeamBalance == true)) {
    uVar9 = (pCVar1->m_GameInfo).m_aTeamSize[0] - (pCVar1->m_GameInfo).m_aTeamSize[1];
    uVar3 = -uVar9;
    if (0 < (int)uVar9) {
      uVar3 = uVar9;
    }
    if (1 < uVar3) {
      if (RenderTeambalanceWarning()::s_Cursor == '\0') {
        iVar4 = __cxa_guard_acquire(&RenderTeambalanceWarning()::s_Cursor);
        if (iVar4 != 0) {
          CTextCursor::CTextCursor(&RenderTeambalanceWarning::s_Cursor,6.0,5.0,50.0,0);
          __cxa_atexit(CTextCursor::~CTextCursor,&RenderTeambalanceWarning::s_Cursor,&__dso_handle);
          __cxa_guard_release(&RenderTeambalanceWarning()::s_Cursor);
        }
      }
      iVar5 = time_get();
      iVar6 = time_freq();
      uVar7 = iVar5 / (iVar6 / 2);
      pcVar8 = Localize("Please balance teams!","");
      if ((uVar7 & 1) == 0) {
        uVar12 = 0x3f000000;
        uVar10 = 0x3f800000;
        uVar11 = 0x3f800000;
      }
      else {
        uVar10 = 0x3f333333;
        uVar12 = 0x3e4ccccd;
        uVar11 = 0x3f333333;
      }
      (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
                (uVar10,uVar11,uVar12,0x3f800000);
      CTextCursor::Reset(&RenderTeambalanceWarning::s_Cursor,
                         (long)(int)(((uint)uVar7 & 1) + g_Localization.m_CurrentVersion * 2 ^ 1));
      pIVar2 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar2->super_IInterface)._vptr_IInterface[0xb])
                (pIVar2,&RenderTeambalanceWarning::s_Cursor,pcVar8,0xffffffffffffffff);
      (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
                (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
      return;
    }
  }
  return;
}

Assistant:

void CHud::RenderTeambalanceWarning()
{
	// render prompt about team-balance
	if(m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_TEAMS && Config()->m_ClWarningTeambalance && m_pClient->m_ServerSettings.m_TeamBalance &&
		absolute(m_pClient->m_GameInfo.m_aTeamSize[TEAM_RED]-m_pClient->m_GameInfo.m_aTeamSize[TEAM_BLUE]) >= NUM_TEAMS)
	{
		static CTextCursor s_Cursor(6.0f, 5.0f, 50.0f);

		bool Flash = time_get()/(time_freq()/2)%2 == 0;
		const char *pText = Localize("Please balance teams!");
		if(Flash)
			TextRender()->TextColor(1,1,0.5f,1);
		else
			TextRender()->TextColor(0.7f,0.7f,0.2f,1.0f);
		
		s_Cursor.Reset(g_Localization.Version() << 1 | (Flash ? 1 : 0));
		TextRender()->TextOutlined(&s_Cursor, pText, -1);
		TextRender()->TextColor(1,1,1,1);
	}
}